

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_entry_from_file.c
# Opt level: O1

int archive_read_disk_entry_from_file(archive *_a,archive_entry *entry,int fd,stat *st)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  mode_t mVar7;
  int iVar8;
  wchar_t wVar9;
  char *pcVar10;
  la_int64_t lVar11;
  char *pcVar12;
  size_t sVar14;
  int *piVar15;
  long lVar16;
  void *__value;
  size_t size;
  __off_t _Var17;
  __off_t __offset;
  long lVar18;
  char *__s1;
  ulong uVar19;
  byte *pbVar20;
  stat s;
  int stflags;
  int local_10f0;
  int local_10ec;
  char *local_10e8;
  long local_10e0;
  char *local_10d8;
  ulong local_10d0;
  stat local_10c8;
  long local_1038 [2];
  undefined4 local_1028;
  uint local_1024;
  undefined4 local_1020;
  byte local_ff0 [4032];
  ssize_t sVar13;
  
  local_10f0 = fd;
  iVar4 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_entry_from_file");
  if (iVar4 == -0x1e) {
    return -0x1e;
  }
  archive_clear_error(_a);
  pcVar10 = archive_entry_sourcepath(entry);
  if (pcVar10 == (char *)0x0) {
    pcVar10 = archive_entry_pathname(entry);
  }
  if (*(long *)&_a[1].archive_format == 0) {
    if (st == (stat *)0x0) {
      if (local_10f0 < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          st = &local_10c8;
          iVar4 = lstat(pcVar10,(stat *)st);
          if (iVar4 != 0) {
            piVar15 = __errno_location();
            iVar4 = *piVar15;
            pcVar12 = "Can\'t lstat %s";
            goto LAB_00177347;
          }
        }
        else {
          st = &local_10c8;
          iVar4 = stat(pcVar10,(stat *)st);
          if (iVar4 != 0) {
            piVar15 = __errno_location();
            iVar4 = *piVar15;
            pcVar12 = "Can\'t stat %s";
LAB_00177347:
            archive_set_error(_a,iVar4,pcVar12,pcVar10);
            return -0x19;
          }
        }
      }
      else {
        st = &local_10c8;
        iVar4 = fstat(local_10f0,(stat *)st);
        if (iVar4 != 0) {
          piVar15 = __errno_location();
          archive_set_error(_a,*piVar15,"Can\'t fstat");
          return -0x19;
        }
      }
    }
    archive_entry_copy_stat(entry,st);
  }
  lVar11 = archive_entry_uid(entry);
  pcVar12 = archive_read_disk_uname(_a,lVar11);
  if (pcVar12 != (char *)0x0) {
    archive_entry_copy_uname(entry,pcVar12);
  }
  lVar11 = archive_entry_gid(entry);
  pcVar12 = archive_read_disk_gname(_a,lVar11);
  if (pcVar12 != (char *)0x0) {
    archive_entry_copy_gname(entry,pcVar12);
  }
  if ((((ulong)_a[1].error_string.s & 0x40) == 0) && ((st->st_mode & 0xf000) == 0x4000)) {
    if (local_10f0 < 0) {
      if (*(long *)&_a[1].archive_format == 0) {
        local_10f0 = open(pcVar10,0x80800);
      }
      else {
        local_10f0 = (*(code *)_a[1].archive_format_name)
                               (*(long *)&_a[1].archive_format,pcVar10,0x80800);
      }
      __archive_ensure_cloexec_flag(local_10f0);
    }
    if (-1 < local_10f0) {
      iVar4 = ioctl(local_10f0,0x80086601,local_1038);
      if ((int)local_1038[0] != 0 && iVar4 == 0) {
        archive_entry_set_fflags(entry,(long)(int)local_1038[0],0);
      }
    }
  }
  if ((st->st_mode & 0xf000) == 0xa000) {
    sVar14 = st->st_size;
    local_10ec = fd;
    pcVar12 = (char *)malloc(sVar14 + 1);
    if (pcVar12 == (char *)0x0) {
      archive_set_error(_a,0xc,"Couldn\'t read link data");
LAB_001771ef:
      bVar2 = false;
      iVar4 = -0x19;
    }
    else {
      if (*(long *)&_a[1].archive_format == 0) {
        sVar13 = readlink(pcVar10,pcVar12,sVar14);
        uVar5 = (uint)sVar13;
      }
      else {
        iVar4 = (**(code **)&_a[1].file_count)();
        sVar13 = readlinkat(iVar4,pcVar10,pcVar12,sVar14);
        uVar5 = (uint)sVar13;
      }
      if ((int)uVar5 < 0) {
        piVar15 = __errno_location();
        archive_set_error(_a,*piVar15,"Couldn\'t read link data");
        free(pcVar12);
        goto LAB_001771ef;
      }
      pcVar12[uVar5 & 0x7fffffff] = '\0';
      archive_entry_set_symlink(entry,pcVar12);
      free(pcVar12);
      iVar4 = -0x1e;
      bVar2 = true;
    }
    fd = local_10ec;
    if (!bVar2) {
      return iVar4;
    }
  }
  iVar4 = 0;
  if (((ulong)_a[1].error_string.s & 0x10) == 0) {
    if (local_10f0 < 0) {
      pcVar10 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10f0);
      if (pcVar10 != (char *)0x0) goto LAB_0017723a;
LAB_001775d7:
      iVar4 = -0x14;
    }
    else {
      pcVar10 = (char *)0x0;
LAB_0017723a:
      if (local_10f0 < 0) {
        if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
          sVar14 = llistxattr(pcVar10,(char *)0x0,0);
        }
        else {
          sVar14 = listxattr(pcVar10,(char *)0x0,0);
        }
      }
      else {
        sVar14 = flistxattr(local_10f0,(char *)0x0,0);
      }
      if (sVar14 == 0) {
LAB_001775b1:
        iVar4 = 0;
      }
      else if (sVar14 == 0xffffffffffffffff) {
        piVar15 = __errno_location();
        iVar6 = *piVar15;
        if (iVar6 == 0x26) goto LAB_001775b1;
        iVar4 = 0;
        if (iVar6 != 0x5f) {
          archive_set_error(_a,iVar6,"Couldn\'t list extended attributes");
          goto LAB_001775d7;
        }
      }
      else {
        local_10e8 = (char *)malloc(sVar14);
        if (local_10e8 != (char *)0x0) {
          if (local_10f0 < 0) {
            if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
              lVar16 = llistxattr(pcVar10,local_10e8,sVar14);
            }
            else {
              lVar16 = listxattr(pcVar10,local_10e8,sVar14);
            }
          }
          else {
            lVar16 = flistxattr(local_10f0,local_10e8,sVar14);
          }
          if (lVar16 == -1) {
            piVar15 = __errno_location();
            archive_set_error(_a,*piVar15,"Couldn\'t retrieve extended attributes");
            free(local_10e8);
            goto LAB_001775d7;
          }
          pcVar12 = local_10e8;
          __s1 = local_10e8;
          iVar4 = fd;
          local_10d8 = pcVar10;
          if (0 < lVar16) {
            do {
              local_10e0 = lVar16;
              local_10ec = iVar4;
              iVar4 = strncmp(__s1,"system.",7);
              if (iVar4 == 0) {
                iVar4 = strcmp(__s1 + 7,"posix_acl_access");
                if ((iVar4 != 0) && (iVar4 = strcmp(__s1 + 7,"posix_acl_default"), iVar4 != 0))
                goto LAB_001773b0;
              }
              else {
LAB_001773b0:
                iVar4 = strncmp(__s1,"trusted.SGI_",0xc);
                if (iVar4 == 0) {
                  iVar4 = strcmp(__s1 + 0xc,"ACL_DEFAULT");
                  if ((iVar4 == 0) || (iVar4 = strcmp(__s1 + 0xc,"ACL_FILE"), iVar4 == 0))
                  goto LAB_00177587;
                }
                iVar6 = strncmp(__s1,"xfsroot.",8);
                iVar4 = local_10f0;
                if (iVar6 != 0) {
                  if (local_10f0 < 0) {
                    if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                      sVar14 = lgetxattr(local_10d8,__s1,(void *)0x0,0);
                    }
                    else {
                      sVar14 = getxattr(local_10d8,__s1,(void *)0x0,0);
                    }
                  }
                  else {
                    sVar14 = fgetxattr(local_10f0,__s1,(void *)0x0,0);
                  }
                  if (sVar14 == 0xffffffffffffffff) {
                    piVar15 = __errno_location();
                    archive_set_error(_a,*piVar15,"Couldn\'t query extended attribute");
                    fd = local_10ec;
                  }
                  else {
                    if ((long)sVar14 < 1) {
                      __value = (void *)0x0;
                    }
                    else {
                      __value = malloc(sVar14);
                      if (__value == (void *)0x0) {
                        piVar15 = __errno_location();
                        archive_set_error(_a,*piVar15,"Out of memory");
                        pcVar12 = local_10e8;
                        fd = local_10ec;
                        goto LAB_00177587;
                      }
                    }
                    if (iVar4 < 0) {
                      if (*(char *)((long)&_a[1].vtable + 1) == '\0') {
                        size = lgetxattr(local_10d8,__s1,__value,sVar14);
                      }
                      else {
                        size = getxattr(local_10d8,__s1,__value,sVar14);
                      }
                    }
                    else {
                      size = fgetxattr(iVar4,__s1,__value,sVar14);
                    }
                    fd = local_10ec;
                    if (size == 0xffffffffffffffff) {
                      piVar15 = __errno_location();
                      archive_set_error(_a,*piVar15,"Couldn\'t read extended attribute");
                    }
                    else {
                      archive_entry_xattr_add_entry(entry,__s1,__value,size);
                    }
                    free(__value);
                    pcVar12 = local_10e8;
                  }
                }
              }
LAB_00177587:
              sVar14 = strlen(__s1);
              __s1 = __s1 + sVar14 + 1;
              iVar4 = local_10ec;
              lVar16 = local_10e0;
            } while ((long)__s1 - (long)pcVar12 < local_10e0);
          }
          free(pcVar12);
          goto LAB_001775b1;
        }
        piVar15 = __errno_location();
        archive_set_error(_a,*piVar15,"Out of memory");
        iVar4 = -0x1e;
      }
    }
  }
  if (((ulong)_a[1].error_string.s & 0x80) != 0) goto LAB_001779b0;
  mVar7 = archive_entry_filetype(entry);
  iVar6 = 0;
  if (((mVar7 == 0x8000) && (lVar11 = archive_entry_size(entry), 0 < lVar11)) &&
     (pcVar10 = archive_entry_hardlink(entry), pcVar10 == (char *)0x0)) {
    local_10e0 = CONCAT44(local_10e0._4_4_,iVar4);
    if (local_10f0 < 0) {
      pcVar10 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,&local_10f0);
    }
    else {
      pcVar10 = (char *)0x0;
    }
    if (local_10f0 < 0) {
      iVar6 = -0x19;
      if (pcVar10 != (char *)0x0) {
        local_10f0 = open(pcVar10,0x80800);
        if (-1 < local_10f0) {
          __archive_ensure_cloexec_flag(local_10f0);
          pcVar10 = (char *)0x0;
          goto LAB_001776a9;
        }
LAB_00177a79:
        iVar6 = -0x19;
        piVar15 = __errno_location();
        archive_set_error(_a,*piVar15,"Can\'t open `%s\'",pcVar10);
      }
    }
    else {
      pcVar12 = (char *)lseek(local_10f0,0,1);
      pcVar10 = (char *)0x0;
      if (pcVar12 != (char *)0x0) {
        lseek(local_10f0,0,0);
        pcVar10 = pcVar12;
      }
LAB_001776a9:
      iVar6 = 0;
      _Var17 = lseek(local_10f0,0,4);
      if (_Var17 < 0) {
        mVar7 = archive_entry_filetype(entry);
        iVar4 = (int)local_10e0;
        if (((mVar7 == 0x8000) && (lVar11 = archive_entry_size(entry), 0 < lVar11)) &&
           (pcVar10 = archive_entry_hardlink(entry), pcVar10 == (char *)0x0)) {
          if (local_10f0 < 0) {
            pcVar10 = archive_read_disk_entry_setup_path((archive_read_disk *)_a,entry,(int *)0x0);
            iVar6 = -0x19;
            if (pcVar10 == (char *)0x0) goto LAB_001779a5;
            if (*(long *)&_a[1].archive_format == 0) {
              local_10f0 = open(pcVar10,0x80800);
            }
            else {
              local_10f0 = (*(code *)_a[1].archive_format_name)
                                     (*(long *)&_a[1].archive_format,pcVar10,0x80800);
            }
            if (local_10f0 < 0) goto LAB_00177a79;
            __archive_ensure_cloexec_flag(local_10f0);
            iVar4 = (int)local_10e0;
          }
          memset(local_1038,0,0x1000);
          local_1038[1] = 0xffffffffffffffff;
          local_1028 = 1;
          local_1020 = 0x48;
          local_10e8 = (char *)archive_entry_size(entry);
          bVar2 = true;
          uVar19 = 0xc020660b;
          local_10d8 = (char *)((ulong)local_10d8 & 0xffffffff00000000);
          local_10d0 = 0xc020660b;
          local_10ec = fd;
          do {
            iVar6 = 0;
            iVar8 = ioctl(local_10f0,uVar19,local_1038);
            if (iVar8 < 0) {
LAB_0017790d:
              bVar1 = false;
            }
            else if (local_1024 == 0) {
              if ((int)local_10d8 != 0) goto LAB_0017790d;
              bVar1 = false;
              archive_entry_sparse_add_entry(entry,0,0);
            }
            else {
              if (0 < (int)local_1024) {
                iVar8 = 0;
                pbVar20 = local_ff0;
                do {
                  if ((pbVar20[1] & 8) == 0) {
                    lVar16 = *(long *)(pbVar20 + -0x28);
                    pcVar10 = (char *)(lVar16 + *(long *)(pbVar20 + -0x18));
                    lVar18 = 0;
                    if (local_10e8 <= pcVar10) {
                      lVar18 = (long)pcVar10 - (long)local_10e8;
                    }
                    pcVar10 = (char *)(*(long *)(pbVar20 + -0x18) - lVar18);
                    bVar1 = pcVar10 == local_10e8;
                    bVar3 = false;
                    if ((!bVar1 || lVar16 != 0) && (bVar3 = bVar2, 0 < (long)pcVar10)) {
                      archive_entry_sparse_add_entry(entry,lVar16,(la_int64_t)pcVar10);
                    }
                    bVar2 = bVar3;
                    iVar4 = (int)local_10e0;
                    if (bVar1 && lVar16 == 0) break;
                  }
                  if ((*pbVar20 & 1) != 0) {
                    bVar2 = false;
                  }
                  iVar8 = iVar8 + 1;
                  pbVar20 = pbVar20 + 0x38;
                } while (iVar8 < (int)local_1024);
              }
              uVar19 = local_10d0;
              if (!bVar2) {
                bVar2 = false;
                goto LAB_0017790d;
              }
              local_1038[0] =
                   local_1038[(ulong)local_1024 * 7 + -1] +
                   local_10c8.__glibc_reserved[(ulong)local_1024 * 7];
              bVar1 = true;
              bVar2 = true;
            }
            local_10d8 = (char *)CONCAT44(local_10d8._4_4_,(int)local_10d8 + 1);
            fd = local_10ec;
          } while (bVar1);
        }
        goto LAB_001779a9;
      }
      local_10e8 = pcVar10;
      if (_Var17 != 0) {
        lseek(local_10f0,0,0);
      }
      local_10ec = fd;
      lVar11 = archive_entry_size(entry);
      if (lVar11 < 1) {
LAB_00177943:
        iVar6 = 0;
      }
      else {
        _Var17 = 0;
        while (__offset = lseek(local_10f0,_Var17,3), __offset != -1) {
          _Var17 = lseek(local_10f0,__offset,4);
          if (_Var17 == -1) {
            piVar15 = __errno_location();
            if (*piVar15 == 6) {
              _Var17 = lseek(local_10f0,0,2);
              iVar6 = 0;
              if (_Var17 != -1) goto LAB_00177990;
            }
            iVar4 = *piVar15;
            pcVar10 = "lseek(SEEK_DATA) failed";
            goto LAB_00177980;
          }
          iVar6 = 0;
          if ((_Var17 == lVar11 && __offset == 0) ||
             (archive_entry_sparse_add_entry(entry,__offset,_Var17 - __offset), iVar6 = 0,
             lVar11 <= _Var17)) goto LAB_00177990;
        }
        piVar15 = __errno_location();
        iVar4 = *piVar15;
        if (iVar4 == 6) {
          wVar9 = archive_entry_sparse_count(entry);
          if (wVar9 != L'\0') goto LAB_00177943;
          _Var17 = lseek(local_10f0,0,4);
          iVar6 = 0;
          if (_Var17 == 0) {
            _Var17 = lseek(local_10f0,0,2);
            iVar6 = 0;
            if (_Var17 == lVar11) {
              archive_entry_sparse_add_entry(entry,0,0);
              iVar6 = 0;
            }
          }
        }
        else {
          pcVar10 = "lseek(SEEK_HOLE) failed";
LAB_00177980:
          archive_set_error(_a,iVar4,pcVar10);
          iVar6 = -0x19;
        }
      }
LAB_00177990:
      lseek(local_10f0,(__off_t)local_10e8,0);
      fd = local_10ec;
    }
LAB_001779a5:
    iVar4 = (int)local_10e0;
  }
LAB_001779a9:
  if (iVar6 < iVar4) {
    iVar4 = iVar6;
  }
LAB_001779b0:
  if (local_10f0 != fd) {
    close(local_10f0);
  }
  return iVar4;
}

Assistant:

int
archive_read_disk_entry_from_file(struct archive *_a,
    struct archive_entry *entry,
    int fd,
    const struct stat *st)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	const char *path, *name;
	struct stat s;
	int initial_fd = fd;
	int r, r1;

	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC, ARCHIVE_STATE_ANY,
		"archive_read_disk_entry_from_file");

	archive_clear_error(_a);
	path = archive_entry_sourcepath(entry);
	if (path == NULL)
		path = archive_entry_pathname(entry);

	if (a->tree == NULL) {
		if (st == NULL) {
#if HAVE_FSTAT
			if (fd >= 0) {
				if (fstat(fd, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't fstat");
					return (ARCHIVE_FAILED);
				}
			} else
#endif
#if HAVE_LSTAT
			if (!a->follow_symlinks) {
				if (lstat(path, &s) != 0) {
					archive_set_error(&a->archive, errno,
					    "Can't lstat %s", path);
					return (ARCHIVE_FAILED);
				}
			} else
#endif
			if (la_stat(path, &s) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't stat %s", path);
				return (ARCHIVE_FAILED);
			}
			st = &s;
		}
		archive_entry_copy_stat(entry, st);
	}

	/* Lookup uname/gname */
	name = archive_read_disk_uname(_a, archive_entry_uid(entry));
	if (name != NULL)
		archive_entry_copy_uname(entry, name);
	name = archive_read_disk_gname(_a, archive_entry_gid(entry));
	if (name != NULL)
		archive_entry_copy_gname(entry, name);

#ifdef HAVE_STRUCT_STAT_ST_FLAGS
	/* On FreeBSD, we get flags for free with the stat. */
	/* TODO: Does this belong in copy_stat()? */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 && st->st_flags != 0)
		archive_entry_set_fflags(entry, st->st_flags, 0);
#endif

#if (defined(FS_IOC_GETFLAGS) && defined(HAVE_WORKING_FS_IOC_GETFLAGS)) || \
    (defined(EXT2_IOC_GETFLAGS) && defined(HAVE_WORKING_EXT2_IOC_GETFLAGS))
	/* Linux requires an extra ioctl to pull the flags.  Although
	 * this is an extra step, it has a nice side-effect: We get an
	 * open file descriptor which we can use in the subsequent lookups. */
	if ((a->flags & ARCHIVE_READDISK_NO_FFLAGS) == 0 &&
	    (S_ISREG(st->st_mode) || S_ISDIR(st->st_mode))) {
		if (fd < 0) {
			if (a->tree != NULL)
				fd = a->open_on_current_dir(a->tree, path,
					O_RDONLY | O_NONBLOCK | O_CLOEXEC);
			else
				fd = open(path, O_RDONLY | O_NONBLOCK |
						O_CLOEXEC);
			__archive_ensure_cloexec_flag(fd);
		}
		if (fd >= 0) {
			int stflags;
			r = ioctl(fd,
#if defined(FS_IOC_GETFLAGS)
			    FS_IOC_GETFLAGS,
#else
			    EXT2_IOC_GETFLAGS,
#endif
			    &stflags);
			if (r == 0 && stflags != 0)
				archive_entry_set_fflags(entry, stflags, 0);
		}
	}
#endif

#if defined(HAVE_READLINK) || defined(HAVE_READLINKAT)
	if (S_ISLNK(st->st_mode)) {
		size_t linkbuffer_len = st->st_size;
		char *linkbuffer;
		int lnklen;

		linkbuffer = malloc(linkbuffer_len + 1);
		if (linkbuffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Couldn't read link data");
			return (ARCHIVE_FAILED);
		}
		if (a->tree != NULL) {
#ifdef HAVE_READLINKAT
			lnklen = readlinkat(a->tree_current_dir_fd(a->tree),
			    path, linkbuffer, linkbuffer_len);
#else
			if (a->tree_enter_working_dir(a->tree) != 0) {
				archive_set_error(&a->archive, errno,
				    "Couldn't read link data");
				free(linkbuffer);
				return (ARCHIVE_FAILED);
			}
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
#endif /* HAVE_READLINKAT */
		} else
			lnklen = readlink(path, linkbuffer, linkbuffer_len);
		if (lnklen < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't read link data");
			free(linkbuffer);
			return (ARCHIVE_FAILED);
		}
		linkbuffer[lnklen] = '\0';
		archive_entry_set_symlink(entry, linkbuffer);
		free(linkbuffer);
	}
#endif /* HAVE_READLINK || HAVE_READLINKAT */

	r = 0;
	if ((a->flags & ARCHIVE_READDISK_NO_ACL) == 0)
		r = archive_read_disk_entry_setup_acls(a, entry, &fd);
	if ((a->flags & ARCHIVE_READDISK_NO_XATTR) == 0) {
		r1 = setup_xattrs(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if (a->flags & ARCHIVE_READDISK_MAC_COPYFILE) {
		r1 = setup_mac_metadata(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}
	if ((a->flags & ARCHIVE_READDISK_NO_SPARSE) == 0) {
		r1 = setup_sparse(a, entry, &fd);
		if (r1 < r)
			r = r1;
	}

	/* If we opened the file earlier in this function, close it. */
	if (initial_fd != fd)
		close(fd);
	return (r);
}